

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O3

string * __thiscall
duckdb::TableRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TableRelation *this,idx_t depth)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  pointer catalog;
  pointer pTVar4;
  pointer pTVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_00
  ;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_48,(Relation *)depth,depth);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_48);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_78 = *puVar7;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar7;
    local_88 = (ulong *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = &this->description;
  catalog = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
            ::operator->(this_00);
  pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_00);
  pTVar5 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_00);
  ParseInfo::QualifierToString(&local_68,&catalog->database,&pTVar4->schema,&pTVar5->table);
  uVar9 = 0xf;
  if (local_88 != &local_78) {
    uVar9 = local_78;
  }
  if (uVar9 < local_68._M_string_length + local_80) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar10 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar10) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_016210ee;
    }
  }
  puVar6 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_016210ee:
  local_a8 = &local_98;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar6[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (undefined8 *)*puVar6;
  }
  local_a0 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar8) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string TableRelation::ToString(idx_t depth) {
	return RenderWhitespace(depth) + "Scan Table [" +
	       ParseInfo::QualifierToString(description->database, description->schema, description->table) + "]";
}